

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O0

void __thiscall
Clasp::SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject> *this,LemmaLogger *x)

{
  bool bVar1;
  LemmaLogger *pLVar2;
  FILE *pFVar3;
  LemmaLogger *in_RSI;
  LemmaLogger *in_RDI;
  DeleteObject deleter;
  
  pLVar2 = get((SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject> *)0x11f546);
  if ((in_RSI != pLVar2) &&
     (bVar1 = is_owner((SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject> *)0x11f55c),
     bVar1)) {
    release((SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject> *)in_RSI);
    DeleteObject::operator()((DeleteObject *)in_RSI,in_RDI);
  }
  pFVar3 = (FILE *)set_bit<unsigned_long>((unsigned_long)in_RSI,(uint)((ulong)in_RDI >> 0x20));
  in_RDI->str_ = pFVar3;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}